

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_recv(nn_sock *self,nn_msg *msg,int flags)

{
  nn_ctx *self_00;
  int iVar1;
  int extraout_EAX;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  
  if ((self->socktype->flags & 1) == 0) {
    self_00 = &self->ctx;
    nn_ctx_enter(self_00);
    if (self->rcvtimeo < 0) {
      lVar4 = 0xffffffff;
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar2 = nn_clock_ms();
      lVar4 = (long)self->rcvtimeo;
      uVar3 = uVar2 + lVar4;
    }
    iVar1 = -9;
    if (2 < self->state - 3U) {
      do {
        iVar1 = (*self->sockbase->vfptr->recv)(self->sockbase,msg);
        if (iVar1 == 0) {
          iVar1 = 0;
          break;
        }
        if (-1 < iVar1) {
          nn_sock_recv_cold_2();
          iVar1 = extraout_EAX;
LAB_00152238:
          if (iVar1 == -0x6e) {
            return -0x6e;
          }
          if (iVar1 == -4) {
            return -4;
          }
          if (iVar1 == -9) {
            return -9;
          }
          nn_sock_recv_cold_1();
        }
        if (iVar1 != -0xb) break;
        nn_ctx_leave(self_00);
        if ((flags & 1U) != 0) {
          return -0xb;
        }
        iVar1 = nn_efd_wait(&self->rcvfd,(int)lVar4);
        if (iVar1 != 0) goto LAB_00152238;
        nn_ctx_enter(self_00);
        iVar1 = nn_efd_wait(&self->rcvfd,0);
        if (iVar1 == 0) {
          *(byte *)&self->flags = (byte)self->flags | 1;
        }
        if (-1 < self->rcvtimeo) {
          uVar2 = nn_clock_ms();
          lVar4 = 0;
          if (uVar2 <= uVar3) {
            lVar4 = uVar3 - uVar2;
          }
        }
        iVar1 = -9;
      } while (2 < self->state - 3U);
    }
    nn_ctx_leave(self_00);
  }
  else {
    iVar1 = -0x5f;
  }
  return iVar1;
}

Assistant:

int nn_sock_recv (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for receiving messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for RCVTIMEO timer. */
    if (self->rcvtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->rcvtimeo;
        timeout = self->rcvtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to receive the message in a non-blocking way. */
        rc = self->sockbase->vfptr->recv (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be received at the moment and the recv call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking recv, wait while there are new pipes available
            for receiving. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->rcvfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for receiving
         */
        if (!nn_efd_wait (&self->rcvfd, 0)) {
            self->flags |= NN_SOCK_FLAG_IN;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->rcvtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}